

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O0

void resetPCanonPermArray_6Vars(char *x)

{
  char *x_local;
  
  builtin_strncpy(x,"abcdef",6);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

void resetPCanonPermArray_6Vars(char* x)
{
    x[0]='a';
    x[1]='b';
    x[2]='c';
    x[3]='d';
    x[4]='e';
    x[5]='f';
}